

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O2

char * sprintf_alloc(char *fmt,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &stack0x00000008;
  local_108 = 0x3000000008;
  local_f8 = local_e8;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vsnprintf((char *)0x0,0,fmt,&local_108);
  __s = (char *)get_ioblob((long)iVar1 + 1U);
  local_108 = 0x3000000008;
  local_100 = &stack0x00000008;
  local_f8 = local_e8;
  iVar2 = vsnprintf(__s,(long)iVar1 + 1U,fmt,&local_108);
  pcVar3 = (char *)0x0;
  if (iVar2 == iVar1) {
    pcVar3 = __s;
  }
  return pcVar3;
}

Assistant:

char *sprintf_alloc(const char *fmt, ...)
{
    va_list ap;
    va_start(ap, fmt);
    const size_t len = vsnprintf(NULL, 0, fmt, ap);
    va_end(ap);

    char *retval = (char *) get_ioblob(len + 1);
    va_start(ap, fmt);
    if (vsnprintf(retval, len + 1, fmt, ap) != len) {
        retval = NULL;
    }
    va_end(ap);

    return retval;
}